

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_reader_skip_using_fill(mpack_reader_t *reader,size_t count)

{
  size_t sVar1;
  ulong min_bytes;
  
  min_bytes = reader->size;
  if (min_bytes < count) {
    do {
      sVar1 = mpack_fill_range(reader,reader->buffer,min_bytes,min_bytes);
      if (sVar1 < reader->size) goto LAB_0010a7e7;
      count = count - reader->size;
      min_bytes = reader->size;
    } while (min_bytes < count);
  }
  reader->data = reader->buffer;
  sVar1 = mpack_fill_range(reader,reader->buffer,count,min_bytes);
  if (sVar1 < count) {
LAB_0010a7e7:
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_io;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_io);
        return;
      }
    }
  }
  else {
    reader->end = reader->data + sVar1;
    reader->data = reader->data + count;
  }
  return;
}

Assistant:

MPACK_NOINLINE static void mpack_reader_skip_using_fill(mpack_reader_t* reader, size_t count) {
    mpack_assert(reader->fill != NULL, "missing fill function!");
    mpack_assert(reader->data == reader->end, "there are bytes left in the buffer!");
    mpack_assert(reader->error == mpack_ok, "should not have called this in an error state (%i)", reader->error);
    mpack_log("skip using fill for %i bytes\n", (int)count);

    // fill and discard multiples of the buffer size
    while (count > reader->size) {
        mpack_log("filling and discarding buffer of %i bytes\n", (int)reader->size);
        if (mpack_fill_range(reader, reader->buffer, reader->size, reader->size) < reader->size) {
            mpack_reader_flag_error(reader, mpack_error_io);
            return;
        }
        count -= reader->size;
    }

    // fill the buffer as much as possible
    reader->data = reader->buffer;
    size_t read = mpack_fill_range(reader, reader->buffer, count, reader->size);
    if (read < count) {
        mpack_reader_flag_error(reader, mpack_error_io);
        return;
    }
    reader->end = reader->data + read;
    mpack_log("filled %i bytes into buffer; discarding %i bytes\n", (int)read, (int)count);
    reader->data += count;
}